

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.cpp
# Opt level: O0

CK_RV __thiscall Token::getTokenInfo(Token *this,CK_TOKEN_INFO_PTR info)

{
  byte bVar1;
  uchar *puVar2;
  size_t sVar3;
  char *pcVar4;
  size_t sVar5;
  tm *__tp;
  char *in_RSI;
  long in_RDI;
  char dateTime [17];
  time_t rawtime;
  char model [17];
  char mfgID [33];
  ByteString serial;
  ByteString label;
  MutexLocker lock;
  ByteString *in_stack_fffffffffffffe98;
  MutexLocker *in_stack_fffffffffffffea0;
  undefined8 local_f8;
  undefined8 local_f0;
  time_t local_e0;
  char local_d8 [32];
  MutexLocker local_b8 [2];
  undefined4 local_8c;
  undefined1 local_88 [56];
  undefined1 local_50 [56];
  char *local_18;
  CK_RV local_8;
  
  local_18 = in_RSI;
  MutexLocker::MutexLocker(in_stack_fffffffffffffea0,(Mutex *)in_stack_fffffffffffffe98);
  ByteString::ByteString((ByteString *)0x1eec02);
  ByteString::ByteString((ByteString *)0x1eec11);
  if (local_18 == (char *)0x0) {
    local_8 = 7;
  }
  else {
    memset(local_18,0x20,0x20);
    memset(local_18 + 0x50,0x20,0x10);
    if (*(long *)(in_RDI + 0x10) == 0) {
      local_18[0x60] = '%';
      local_18[0x61] = '\0';
      local_18[0x62] = -0x40;
      local_18[99] = '\0';
      local_18[100] = '\0';
      local_18[0x65] = '\0';
      local_18[0x66] = '\0';
      local_18[0x67] = '\0';
    }
    else {
      bVar1 = (**(code **)(**(long **)(in_RDI + 0x10) + 0x20))
                        (*(long **)(in_RDI + 0x10),local_18 + 0x60);
      if ((bVar1 & 1) == 0) {
        softHSMLog(3,"getTokenInfo",
                   "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/slot_mgr/Token.cpp"
                   ,0x1e2,"Could not get the token flags");
        local_8 = 5;
        goto LAB_001ef08b;
      }
      bVar1 = (**(code **)(**(long **)(in_RDI + 0x10) + 0x30))(*(long **)(in_RDI + 0x10),local_50);
      pcVar4 = local_18;
      if ((bVar1 & 1) != 0) {
        puVar2 = ByteString::byte_str(in_stack_fffffffffffffe98);
        sVar3 = ByteString::size((ByteString *)0x1eed9e);
        strncpy(pcVar4,(char *)puVar2,sVar3);
      }
      bVar1 = (**(code **)(**(long **)(in_RDI + 0x10) + 0x38))(*(long **)(in_RDI + 0x10),local_88);
      if ((bVar1 & 1) != 0) {
        pcVar4 = local_18 + 0x50;
        puVar2 = ByteString::byte_str(in_stack_fffffffffffffe98);
        sVar3 = ByteString::size((ByteString *)0x1eee15);
        strncpy(pcVar4,(char *)puVar2,sVar3);
      }
    }
    snprintf((char *)local_b8,0x21,"SoftHSM project");
    snprintf(local_d8,0x11,"SoftHSM v2");
    memset(local_18 + 0x20,0x20,0x20);
    memset(local_18 + 0x40,0x20,0x10);
    pcVar4 = local_18 + 0x20;
    in_stack_fffffffffffffea0 = local_b8;
    sVar5 = strlen((char *)local_b8);
    memcpy(pcVar4,in_stack_fffffffffffffea0,sVar5);
    pcVar4 = local_18 + 0x40;
    sVar5 = strlen(local_d8);
    memcpy(pcVar4,local_d8,sVar5);
    local_18[0x70] = -1;
    local_18[0x71] = -1;
    local_18[0x72] = -1;
    local_18[0x73] = -1;
    local_18[0x74] = -1;
    local_18[0x75] = -1;
    local_18[0x76] = -1;
    local_18[0x77] = -1;
    local_18[0x80] = -1;
    local_18[0x81] = -1;
    local_18[0x82] = -1;
    local_18[0x83] = -1;
    local_18[0x84] = -1;
    local_18[0x85] = -1;
    local_18[0x86] = -1;
    local_18[0x87] = -1;
    local_18[0x78] = '\0';
    local_18[0x79] = '\0';
    local_18[0x7a] = '\0';
    local_18[0x7b] = '\0';
    local_18[0x7c] = '\0';
    local_18[0x7d] = '\0';
    local_18[0x7e] = '\0';
    local_18[0x7f] = '\0';
    local_18[0x68] = '\0';
    local_18[0x69] = '\0';
    local_18[0x6a] = '\0';
    local_18[0x6b] = '\0';
    local_18[0x6c] = '\0';
    local_18[0x6d] = '\0';
    local_18[0x6e] = '\0';
    local_18[0x6f] = '\0';
    local_18[0x88] = -1;
    local_18[0x89] = '\0';
    local_18[0x8a] = '\0';
    local_18[0x8b] = '\0';
    local_18[0x8c] = '\0';
    local_18[0x8d] = '\0';
    local_18[0x8e] = '\0';
    local_18[0x8f] = '\0';
    local_18[0x90] = '\x04';
    local_18[0x91] = '\0';
    local_18[0x92] = '\0';
    local_18[0x93] = '\0';
    local_18[0x94] = '\0';
    local_18[0x95] = '\0';
    local_18[0x96] = '\0';
    local_18[0x97] = '\0';
    local_18[0x98] = -1;
    local_18[0x99] = -1;
    local_18[0x9a] = -1;
    local_18[0x9b] = -1;
    local_18[0x9c] = -1;
    local_18[0x9d] = -1;
    local_18[0x9e] = -1;
    local_18[0x9f] = -1;
    local_18[0xa0] = -1;
    local_18[0xa1] = -1;
    local_18[0xa2] = -1;
    local_18[0xa3] = -1;
    local_18[0xa4] = -1;
    local_18[0xa5] = -1;
    local_18[0xa6] = -1;
    local_18[0xa7] = -1;
    local_18[0xa8] = -1;
    local_18[0xa9] = -1;
    local_18[0xaa] = -1;
    local_18[0xab] = -1;
    local_18[0xac] = -1;
    local_18[0xad] = -1;
    local_18[0xae] = -1;
    local_18[0xaf] = -1;
    local_18[0xb0] = -1;
    local_18[0xb1] = -1;
    local_18[0xb2] = -1;
    local_18[0xb3] = -1;
    local_18[0xb4] = -1;
    local_18[0xb5] = -1;
    local_18[0xb6] = -1;
    local_18[0xb7] = -1;
    local_18[0xb8] = '\x02';
    local_18[0xb9] = '\x06';
    local_18[0xba] = '\x02';
    local_18[0xbb] = '\x06';
    time(&local_e0);
    __tp = gmtime(&local_e0);
    strftime((char *)&local_f8,0x11,"%Y%m%d%H%M%S00",__tp);
    *(undefined8 *)(local_18 + 0xbc) = local_f8;
    *(undefined8 *)(local_18 + 0xc4) = local_f0;
    local_8 = 0;
  }
LAB_001ef08b:
  local_8c = 1;
  ByteString::~ByteString((ByteString *)0x1ef098);
  ByteString::~ByteString((ByteString *)0x1ef0a5);
  MutexLocker::~MutexLocker(in_stack_fffffffffffffea0);
  return local_8;
}

Assistant:

CK_RV Token::getTokenInfo(CK_TOKEN_INFO_PTR info)
{
	// Lock access to the token
	MutexLocker lock(tokenMutex);

	ByteString label, serial;

	if (info == NULL)
	{
		return CKR_ARGUMENTS_BAD;
	}

	memset(info->label, ' ', 32);
	memset(info->serialNumber, ' ', 16);

	// Token specific information
	if (token)
	{
		if (!token->getTokenFlags(info->flags))
		{
			ERROR_MSG("Could not get the token flags");
			return CKR_GENERAL_ERROR;
		}

		if (token->getTokenLabel(label))
		{
			strncpy((char*) info->label, (char*) label.byte_str(), label.size());
		}

		if (token->getTokenSerial(serial))
		{
			strncpy((char*) info->serialNumber, (char*) serial.byte_str(), serial.size());
		}
	}
	else
	{
		info->flags =	CKF_RNG |
				CKF_LOGIN_REQUIRED |
				CKF_RESTORE_KEY_NOT_NEEDED |
				CKF_SO_PIN_LOCKED |
				CKF_SO_PIN_TO_BE_CHANGED;
	}

	// Information shared by all tokens
	char mfgID[33];
	char model[17];

	snprintf(mfgID, 33, "SoftHSM project");
	snprintf(model, 17, "SoftHSM v2");

	memset(info->manufacturerID, ' ', 32);
	memset(info->model, ' ', 16);
	memcpy(info->manufacturerID, mfgID, strlen(mfgID));
	memcpy(info->model, model, strlen(model));

	// TODO: Can we set these?
	info->ulSessionCount = CK_UNAVAILABLE_INFORMATION;
	info->ulRwSessionCount = CK_UNAVAILABLE_INFORMATION;

	info->ulMaxRwSessionCount = CK_EFFECTIVELY_INFINITE;
	info->ulMaxSessionCount = CK_EFFECTIVELY_INFINITE;
	info->ulMaxPinLen = MAX_PIN_LEN;
	info->ulMinPinLen = MIN_PIN_LEN;
	info->ulTotalPublicMemory = CK_UNAVAILABLE_INFORMATION;
	info->ulFreePublicMemory = CK_UNAVAILABLE_INFORMATION;
	info->ulTotalPrivateMemory = CK_UNAVAILABLE_INFORMATION;
	info->ulFreePrivateMemory = CK_UNAVAILABLE_INFORMATION;
	info->hardwareVersion.major = VERSION_MAJOR;
	info->hardwareVersion.minor = VERSION_MINOR;
	info->firmwareVersion.major = VERSION_MAJOR;
	info->firmwareVersion.minor = VERSION_MINOR;

	// Current time
	time_t rawtime;
	time(&rawtime);
	char dateTime[17];
	strftime(dateTime, 17, "%Y%m%d%H%M%S00", gmtime(&rawtime));
	memcpy(info->utcTime, dateTime, 16);

		return CKR_OK;
}